

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attributes_encoder.cc
# Opt level: O1

bool __thiscall
draco::AttributesEncoder::EncodeAttributesEncoderData
          (AttributesEncoder *this,EncoderBuffer *out_buffer)

{
  __uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_> _Var1;
  undefined8 in_RAX;
  pointer piVar2;
  undefined8 in_R8;
  undefined8 in_R9;
  ulong uVar3;
  ulong uVar4;
  undefined8 uVar5;
  
  EncodeVarint<unsigned_int>
            ((uint)((ulong)((long)(this->point_attribute_ids_).
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_finish -
                           (long)(this->point_attribute_ids_).
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start) >> 2),out_buffer);
  piVar2 = (this->point_attribute_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((int)((ulong)((long)(this->point_attribute_ids_).super__Vector_base<int,_std::allocator<int>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)piVar2) >> 2) != 0) {
    uVar3 = 0;
    do {
      _Var1._M_t.
      super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>.
      super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl =
           (this->point_cloud_->attributes_).
           super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[piVar2[uVar3]]._M_t.
           super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
           ._M_t;
      uVar5 = CONCAT17(*(undefined1 *)
                        ((long)_Var1._M_t.
                               super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                               .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl +
                        0x38),(int7)in_RAX);
      if (out_buffer->bit_encoder_reserved_bytes_ < 1) {
        std::vector<char,std::allocator<char>>::_M_range_insert<unsigned_char_const*>
                  ((vector<char,std::allocator<char>> *)out_buffer,
                   (out_buffer->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_finish,&stack0xffffffffffffffcf,
                   &stack0xffffffffffffffd0,in_R8,in_R9,uVar5);
      }
      uVar4 = (ulong)CONCAT16(*(undefined1 *)
                               ((long)_Var1._M_t.
                                      super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                                      .super__Head_base<0UL,_draco::PointAttribute_*,_false>.
                                      _M_head_impl + 0x1c),(int6)uVar5);
      if (out_buffer->bit_encoder_reserved_bytes_ < 1) {
        std::vector<char,std::allocator<char>>::_M_range_insert<unsigned_char_const*>
                  ((vector<char,std::allocator<char>> *)out_buffer,
                   (out_buffer->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_finish,&stack0xffffffffffffffce,
                   &stack0xffffffffffffffcf);
      }
      uVar5 = CONCAT26((short)(uVar4 >> 0x30),
                       CONCAT15(*(undefined1 *)
                                 ((long)_Var1._M_t.
                                        super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                                        .super__Head_base<0UL,_draco::PointAttribute_*,_false>.
                                        _M_head_impl + 0x18),(int5)uVar4));
      if (out_buffer->bit_encoder_reserved_bytes_ < 1) {
        std::vector<char,std::allocator<char>>::_M_range_insert<unsigned_char_const*>
                  ((vector<char,std::allocator<char>> *)out_buffer,
                   (out_buffer->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_finish,&stack0xffffffffffffffcd,
                   &stack0xffffffffffffffce);
      }
      in_RAX = CONCAT35((int3)((ulong)uVar5 >> 0x28),
                        CONCAT14(*(undefined1 *)
                                  ((long)_Var1._M_t.
                                         super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                                         .super__Head_base<0UL,_draco::PointAttribute_*,_false>.
                                         _M_head_impl + 0x20),(int)uVar5));
      if (out_buffer->bit_encoder_reserved_bytes_ < 1) {
        std::vector<char,std::allocator<char>>::_M_range_insert<unsigned_char_const*>
                  ((vector<char,std::allocator<char>> *)out_buffer,
                   (out_buffer->buffer_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_finish,&stack0xffffffffffffffcc,
                   &stack0xffffffffffffffcd);
      }
      EncodeVarint<unsigned_int>
                (*(uint *)((long)_Var1._M_t.
                                 super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                                 .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl
                          + 0x3c),out_buffer);
      uVar3 = uVar3 + 1;
      piVar2 = (this->point_attribute_ids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar3 < ((ulong)((long)(this->point_attribute_ids_).
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_finish - (long)piVar2) >> 2 &
                     0xffffffff));
  }
  return true;
}

Assistant:

bool AttributesEncoder::EncodeAttributesEncoderData(EncoderBuffer *out_buffer) {
  // Encode data about all attributes.
  EncodeVarint(num_attributes(), out_buffer);
  for (uint32_t i = 0; i < num_attributes(); ++i) {
    const int32_t att_id = point_attribute_ids_[i];
    const PointAttribute *const pa = point_cloud_->attribute(att_id);
    GeometryAttribute::Type type = pa->attribute_type();
#ifdef DRACO_TRANSCODER_SUPPORTED
    // Attribute types TANGENT, MATERIAL, JOINTS, and WEIGHTS are not supported
    // in the official bitstream. They will be encoded as GENERIC.
    if (type > GeometryAttribute::GENERIC) {
      type = GeometryAttribute::GENERIC;
    }
#endif
    out_buffer->Encode(static_cast<uint8_t>(type));
    out_buffer->Encode(static_cast<uint8_t>(pa->data_type()));
    out_buffer->Encode(static_cast<uint8_t>(pa->num_components()));
    out_buffer->Encode(static_cast<uint8_t>(pa->normalized()));
    EncodeVarint(pa->unique_id(), out_buffer);
  }
  return true;
}